

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O0

void __thiscall ev3dev::nxt_motor::nxt_motor(nxt_motor *this,address_type *address)

{
  string *in_RSI;
  motor_type *in_stack_00000240;
  address_type *in_stack_00000248;
  motor *in_stack_00000250;
  allocator local_51;
  string local_50 [32];
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,motor::motor_nxt,&local_51);
  motor::motor(in_stack_00000250,in_stack_00000248,in_stack_00000240);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

nxt_motor::nxt_motor(address_type address)
    : motor(address, motor_nxt)
{ }